

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageReserve(HelicsMessage message,int reservedSize,HelicsError *err)

{
  HelicsMessage pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001afed7;
    }
    else {
      pvVar1 = (HelicsMessage)0x0;
      if (*(short *)((long)message + 10) == 0xb3) {
        pvVar1 = message;
      }
      if (*(short *)((long)message + 10) == 0xb3 || err == (HelicsError *)0x0) goto LAB_001afed9;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001afed7:
  pvVar1 = (HelicsMessage)0x0;
LAB_001afed9:
  if (pvVar1 != (HelicsMessage)0x0) {
    helics::SmallBuffer::reserve((SmallBuffer *)((long)pvVar1 + 0x10),(long)reservedSize);
  }
  return;
}

Assistant:

void helicsMessageReserve(HelicsMessage message, int reservedSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.reserve(reservedSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}